

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::AppendBuildInterfaceIncludes(cmTarget *this)

{
  cmMakefile *this_00;
  bool bVar1;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var2;
  string *psVar3;
  allocator<char> local_b1;
  string dirs;
  string local_90;
  _Optional_payload_base<cmListFileBacktrace> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  _Var2._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  if ((7 < (_Var2._M_head_impl)->TargetType) ||
     ((0x8eU >> ((_Var2._M_head_impl)->TargetType & 0x1f) & 1) == 0)) {
    bVar1 = IsExecutableWithExports(this);
    if (!bVar1) {
      return;
    }
    _Var2._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  }
  if ((_Var2._M_head_impl)->BuildInterfaceIncludesAppended == false) {
    (_Var2._M_head_impl)->BuildInterfaceIncludesAppended = true;
    this_00 = (_Var2._M_head_impl)->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dirs,"CMAKE_INCLUDE_CURRENT_DIR_IN_INTERFACE",(allocator<char> *)&local_90
              );
    bVar1 = cmMakefile::IsOn(this_00,&dirs);
    std::__cxx11::string::~string((string *)&dirs);
    if (bVar1) {
      psVar3 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                         (((this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                          Makefile);
      std::__cxx11::string::string((string *)&dirs,(string *)psVar3);
      if (dirs._M_string_length != 0) {
        std::__cxx11::string::push_back((char)&dirs);
      }
      cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                (((this->impl)._M_t.
                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
      std::__cxx11::string::append((string *)&dirs);
      if (dirs._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"INTERFACE_INCLUDE_DIRECTORIES",&local_b1);
        std::operator+(&local_58,"$<BUILD_INTERFACE:",&dirs);
        std::operator+(&local_38,&local_58,">");
        local_70._M_engaged = false;
        AppendProperty(this,&local_90,&local_38,(optional<cmListFileBacktrace> *)&local_70,false);
        std::_Optional_payload_base<cmListFileBacktrace>::_M_reset(&local_70);
        std::__cxx11::string::~string((string *)&local_38);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_90);
      }
      std::__cxx11::string::~string((string *)&dirs);
    }
  }
  return;
}

Assistant:

void cmTarget::AppendBuildInterfaceIncludes()
{
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      !this->IsExecutableWithExports()) {
    return;
  }
  if (this->impl->BuildInterfaceIncludesAppended) {
    return;
  }
  this->impl->BuildInterfaceIncludesAppended = true;

  if (this->impl->Makefile->IsOn("CMAKE_INCLUDE_CURRENT_DIR_IN_INTERFACE")) {
    std::string dirs = this->impl->Makefile->GetCurrentBinaryDirectory();
    if (!dirs.empty()) {
      dirs += ';';
    }
    dirs += this->impl->Makefile->GetCurrentSourceDirectory();
    if (!dirs.empty()) {
      this->AppendProperty("INTERFACE_INCLUDE_DIRECTORIES",
                           ("$<BUILD_INTERFACE:" + dirs + ">"));
    }
  }
}